

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listelem_alloc.c
# Opt level: O3

void listelem_alloc_free(listelem_alloc_t *list)

{
  glist_t pgVar1;
  
  if (list != (listelem_alloc_t *)0x0) {
    pgVar1 = list->blocks;
    if (pgVar1 == (glist_t)0x0) {
      pgVar1 = (glist_t)0x0;
    }
    else {
      do {
        ckd_free((pgVar1->data).ptr);
        pgVar1 = pgVar1->next;
      } while (pgVar1 != (gnode_s *)0x0);
      pgVar1 = list->blocks;
    }
    glist_free(pgVar1);
    glist_free(list->blocksize);
    ckd_free(list);
    return;
  }
  return;
}

Assistant:

void
listelem_alloc_free(listelem_alloc_t *list)
{
    gnode_t *gn;
    if (list == NULL)
	return;
    for (gn = list->blocks; gn; gn = gnode_next(gn))
	ckd_free(gnode_ptr(gn));
    glist_free(list->blocks);
    glist_free(list->blocksize);
    ckd_free(list);
}